

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ulong *puVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  uint8_t uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  ulong uVar29;
  ulong local_118;
  ulong local_110;
  size_t *local_f0;
  ulong local_e8;
  ulong local_d8;
  ulong local_c8 [4];
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = (position - 7) + num_bytes;
  local_48 = position;
  if (7 < num_bytes) {
    local_48 = local_88;
  }
  local_50 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_50 = 0x40;
  }
  uVar8 = *(ulong *)dist_cache;
  local_70 = position + num_bytes;
  if (local_70 <= position + 8) {
    local_f0 = last_insert_len;
LAB_001117d8:
    *(ulong *)dist_cache = (uVar8 + local_70) - position;
    *(long *)commands = *(long *)commands + ((long)local_f0 - (long)last_insert_len >> 4);
    return;
  }
  local_a0 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_58 = *(long *)(literal_context_lut + 0x10);
  local_c8[3] = local_50 + position;
  lVar2 = *(long *)&(params->hasher).num_last_distances_to_check;
  local_80 = ringbuffer_mask & 0xffffffff;
  local_68 = (ulong)(uint)((int)local_50 * 4);
  local_60 = (position - 1) + num_bytes;
  local_f0 = last_insert_len;
  uVar10 = local_70;
  uVar17 = position;
LAB_00110cbc:
  uVar10 = uVar10 - uVar17;
  uVar15 = local_a0;
  if (uVar17 < local_a0) {
    uVar15 = uVar17;
  }
  uVar20 = uVar17 & ringbuffer_mask;
  puVar1 = ringbuffer + uVar20;
  uVar11 = ringbuffer[uVar20];
  local_e8 = (ulong)*(int *)&(hasher->common).extra;
  local_d8 = 0x7e4;
  local_80._0_4_ = (uint)ringbuffer_mask;
  if ((uVar17 - local_e8 < uVar17) &&
     (uVar14 = (ulong)((uint)(uVar17 - local_e8) & (uint)local_80), uVar11 == ringbuffer[uVar14])) {
    if (7 < uVar10) {
      local_a8 = uVar10 & 0xfffffffffffffff8;
      puVar21 = ringbuffer + local_a8 + uVar20;
      lVar23 = 0;
      uVar29 = 0;
LAB_00110d4a:
      if (*(ulong *)(puVar1 + uVar29 * 8) == *(ulong *)(ringbuffer + uVar29 * 8 + uVar14))
      goto code_r0x00110d57;
      uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar14) ^ *(ulong *)(puVar1 + uVar29 * 8);
      uVar14 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      uVar29 = (uVar14 >> 3 & 0x1fffffff) - lVar23;
      goto LAB_00110d8f;
    }
    local_a8 = 0;
    puVar21 = puVar1;
LAB_0011179d:
    uVar25 = uVar10 & 7;
    uVar29 = local_a8;
    if (uVar25 != 0) {
      uVar26 = local_a8 | uVar25;
      do {
        uVar29 = local_a8;
        if (ringbuffer[local_a8 + uVar14] != *puVar21) break;
        puVar21 = puVar21 + 1;
        local_a8 = local_a8 + 1;
        uVar25 = uVar25 - 1;
        uVar29 = uVar26;
      } while (uVar25 != 0);
    }
LAB_00110d8f:
    if ((uVar29 < 4) || (uVar14 = uVar29 * 0x87 + 0x78f, uVar14 < 0x7e5)) goto LAB_00110dcb;
    uVar11 = puVar1[uVar29];
    local_d8 = uVar14;
  }
  else {
LAB_00110dcb:
    local_e8 = 0;
    uVar29 = 0;
  }
  local_c8[0] = (ulong)(*(long *)(ringbuffer + uVar20) * -0x42e1ca5843000000) >> 0x30;
  local_c8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar20) * -0x42e1ca5843000000) >>
                                0x30) + 8 & 0xffff);
  local_90 = uVar10 >> 3;
  uVar14 = (ulong)((uint)uVar10 & 7);
  local_98 = uVar10 & 0xfffffffffffffff8;
  puVar7 = local_c8;
  bVar28 = true;
  do {
    bVar27 = bVar28;
    uVar13 = *(uint *)(lVar2 + *puVar7 * 4);
    uVar19 = (uint)local_80 & uVar13;
    if (((uVar11 == ringbuffer[uVar29 + uVar19]) && (uVar17 != uVar13)) &&
       (uVar25 = uVar17 - uVar13, uVar25 <= uVar15)) {
      if (7 < uVar10) {
        lVar23 = 0;
        uVar26 = 0;
LAB_00110e8b:
        if (*(ulong *)(puVar1 + uVar26 * 8) == *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar19))
        goto code_r0x00110e98;
        uVar24 = *(ulong *)(ringbuffer + uVar26 * 8 + (ulong)uVar19) ^
                 *(ulong *)(puVar1 + uVar26 * 8);
        uVar26 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar26 = (uVar26 >> 3 & 0x1fffffff) - lVar23;
        goto LAB_00110ed3;
      }
      uVar24 = 0;
      puVar21 = puVar1;
LAB_00110f38:
      uVar26 = uVar24;
      if (uVar14 != 0) {
        local_c8[2] = uVar14 | uVar24;
        uVar12 = uVar14;
        do {
          uVar26 = uVar24;
          if (ringbuffer[uVar24 + uVar19] != *puVar21) break;
          puVar21 = puVar21 + 1;
          uVar24 = uVar24 + 1;
          uVar12 = uVar12 - 1;
          uVar26 = local_c8[2];
        } while (uVar12 != 0);
      }
LAB_00110ed3:
      if (3 < uVar26) {
        iVar18 = 0x1f;
        if ((uint)uVar25 != 0) {
          for (; (uint)uVar25 >> iVar18 == 0; iVar18 = iVar18 + -1) {
          }
        }
        uVar24 = (ulong)(iVar18 * -0x1e + 0x780) + uVar26 * 0x87;
        if (local_d8 < uVar24) {
          uVar11 = puVar1[uVar26];
          uVar29 = uVar26;
          local_e8 = uVar25;
          local_d8 = uVar24;
        }
      }
    }
    puVar7 = local_c8 + 1;
    bVar28 = false;
  } while (bVar27);
  *(uint *)(lVar2 + *(long *)((long)local_c8 + (ulong)((uint)uVar17 & 8)) * 4) = (uint)uVar17;
  if (0x7e4 < local_d8) {
    local_c8[2] = (ulong)*(int *)&(hasher->common).extra;
    local_40 = uVar8 + 4;
    local_c8[3] = local_60 - uVar17;
    iVar18 = 0;
    uVar15 = uVar8;
LAB_00110fb3:
    local_78 = local_c8[3] >> 3;
    uVar10 = uVar10 - 1;
    local_a8 = uVar29;
    uVar20 = uVar29 - 1;
    if (uVar10 <= uVar29 - 1) {
      uVar20 = uVar10;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar20 = 0;
    }
    uVar14 = uVar17 + 1;
    uVar25 = local_a0;
    if (uVar14 < local_a0) {
      uVar25 = uVar14;
    }
    puVar1 = ringbuffer + (uVar14 & ringbuffer_mask);
    uVar11 = puVar1[uVar20];
    uVar26 = 0x7e4;
    local_98 = CONCAT44(local_98._4_4_,iVar18);
    if ((uVar14 - local_c8[2] < uVar14) &&
       (uVar13 = (uint)(uVar14 - local_c8[2]) & (uint)local_80,
       uVar11 == ringbuffer[uVar20 + uVar13])) {
      if (7 < uVar10) {
        lVar23 = 0;
        uVar24 = 0;
LAB_00111043:
        if (*(ulong *)(puVar1 + uVar24 * 8) == *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar13))
        goto code_r0x00111051;
        uVar12 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar13) ^
                 *(ulong *)(puVar1 + uVar24 * 8);
        uVar24 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        local_110 = (uVar24 >> 3 & 0x1fffffff) - lVar23;
        goto LAB_00111091;
      }
      local_110 = 0;
      puVar21 = puVar1;
      goto LAB_001112ad;
    }
    goto LAB_001110cb;
  }
  uVar8 = uVar8 + 1;
  position = uVar17 + 1;
  if ((num_literals == (size_t *)0x0) && (local_c8[3] < position)) {
    if (local_68 + local_c8[3] < position) {
      uVar10 = uVar17 + 0x11;
      if (local_88 <= uVar17 + 0x11) {
        uVar10 = local_88;
      }
      for (; position < uVar10; position = position + 4) {
        *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        uVar8 = uVar8 + 4;
      }
    }
    else {
      uVar10 = uVar17 + 9;
      if (local_88 <= uVar17 + 9) {
        uVar10 = local_88;
      }
      for (; position < uVar10; position = position + 2) {
        *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        uVar8 = uVar8 + 2;
      }
    }
  }
  goto LAB_00111708;
code_r0x00110d57:
  uVar29 = uVar29 + 1;
  lVar23 = lVar23 + -8;
  if (uVar10 >> 3 == uVar29) goto LAB_0011179d;
  goto LAB_00110d4a;
code_r0x00110e98:
  uVar26 = uVar26 + 1;
  lVar23 = lVar23 + -8;
  uVar24 = local_98;
  puVar21 = ringbuffer + local_98 + uVar20;
  if (uVar10 >> 3 == uVar26) goto LAB_00110f38;
  goto LAB_00110e8b;
code_r0x00111051:
  uVar24 = uVar24 + 1;
  lVar23 = lVar23 + -8;
  if (local_78 == uVar24) goto code_r0x0011105f;
  goto LAB_00111043;
code_r0x0011105f:
  local_110 = -lVar23;
  puVar21 = puVar1 + -lVar23;
LAB_001112ad:
  uVar24 = uVar10 & 7;
  for (; (uVar24 != 0 && (ringbuffer[local_110 + uVar13] == *puVar21)); local_110 = local_110 + 1) {
    puVar21 = puVar21 + 1;
    uVar24 = uVar24 - 1;
  }
LAB_00111091:
  if ((local_110 < 4) || (uVar24 = local_110 * 0x87 + 0x78f, uVar24 < 0x7e5)) {
LAB_001110cb:
    local_118 = 0;
    local_110 = 0;
  }
  else {
    uVar11 = puVar1[local_110];
    uVar26 = uVar24;
    uVar20 = local_110;
    local_118 = local_c8[2];
  }
  local_c8[0] = (ulong)(*(long *)(ringbuffer + (uVar14 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
                0x30;
  local_c8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + (uVar14 & ringbuffer_mask)) *
                                        -0x42e1ca5843000000) >> 0x30) + 8 & 0xffff);
  local_90 = *(long *)((long)local_c8 + (ulong)((uint)uVar14 & 8));
  local_38 = (ulong)((uint)uVar10 & 7);
  puVar7 = local_c8;
  bVar28 = true;
LAB_00111128:
  uVar13 = *(uint *)(lVar2 + *puVar7 * 4);
  uVar19 = (uint)local_80 & uVar13;
  if (((uVar11 == ringbuffer[uVar20 + uVar19]) && (uVar14 != uVar13)) &&
     (uVar24 = uVar14 - uVar13, uVar24 <= uVar25)) {
    uVar12 = local_38;
    if (7 < uVar10) {
      lVar23 = 0;
      uVar22 = 0;
LAB_0011116d:
      if (*(ulong *)(puVar1 + uVar22 * 8) == *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar19))
      goto code_r0x0011117b;
      uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + (ulong)uVar19) ^ *(ulong *)(puVar1 + uVar22 * 8)
      ;
      uVar12 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      uVar22 = (uVar12 >> 3 & 0x1fffffff) - lVar23;
      goto LAB_001111a5;
    }
    uVar22 = 0;
    puVar21 = puVar1;
    goto joined_r0x00111216;
  }
  goto LAB_001111f1;
code_r0x0011117b:
  uVar22 = uVar22 + 1;
  lVar23 = lVar23 + -8;
  if (local_78 == uVar22) goto code_r0x00111189;
  goto LAB_0011116d;
code_r0x00111189:
  uVar22 = -lVar23;
  puVar21 = puVar1 + -lVar23;
joined_r0x00111216:
  for (; (uVar12 != 0 && (ringbuffer[uVar22 + uVar19] == *puVar21)); uVar22 = uVar22 + 1) {
    uVar12 = uVar12 - 1;
    puVar21 = puVar21 + 1;
  }
LAB_001111a5:
  if (3 < uVar22) {
    iVar3 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar12 = (ulong)(iVar3 * -0x1e + 0x780) + uVar22 * 0x87;
    if (uVar26 < uVar12) {
      uVar11 = puVar1[uVar22];
      uVar26 = uVar12;
      uVar20 = uVar22;
      local_118 = uVar24;
      local_110 = uVar22;
    }
  }
LAB_001111f1:
  puVar7 = local_c8 + 1;
  bVar27 = !bVar28;
  bVar28 = false;
  if (bVar27) goto LAB_00111232;
  goto LAB_00111128;
LAB_00111232:
  *(uint *)(lVar2 + local_90 * 4) = (uint)uVar14;
  uVar20 = uVar17;
  uVar25 = uVar15;
  if ((uVar26 < local_d8 + 0xaf) ||
     (uVar29 = local_110, local_e8 = local_118, uVar20 = uVar14, uVar25 = uVar8 + 4, iVar18 == 3))
  goto LAB_001113a9;
  uVar25 = uVar15 + 1;
  iVar18 = iVar18 + 1;
  uVar24 = uVar17 + 9;
  local_c8[3] = local_c8[3] - 1;
  uVar17 = uVar14;
  uVar15 = uVar25;
  local_d8 = uVar26;
  if (local_70 <= uVar24) goto LAB_001113a9;
  goto LAB_00110fb3;
LAB_001113a9:
  uVar8 = local_58 + uVar20;
  if (local_a0 <= uVar8) {
    uVar8 = local_a0;
  }
  uVar13 = (uint)uVar25;
  uVar19 = (uint)uVar29;
  if (uVar8 < local_e8) {
LAB_001113ce:
    uVar17 = local_e8 + 0xf;
  }
  else {
    uVar10 = (ulong)*(int *)&(hasher->common).extra;
    if (local_e8 == uVar10) {
      *(uint *)local_f0 = uVar13;
      *(uint *)((long)local_f0 + 4) = uVar19;
      uVar17 = 0;
      uVar16 = 0;
      goto LAB_001114a6;
    }
    uVar15 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uVar17 = 1;
    if (local_e8 != uVar15) {
      uVar10 = (local_e8 + 3) - uVar10;
      if (uVar10 < 7) {
        bVar9 = (byte)((int)uVar10 << 2);
        uVar16 = 0x9750468;
      }
      else {
        uVar15 = (local_e8 + 3) - uVar15;
        if (6 < uVar15) {
          uVar17 = 2;
          if ((local_e8 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uVar17 = 3, local_e8 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
          goto LAB_001113ce;
          goto LAB_001113d2;
        }
        bVar9 = (byte)((int)uVar15 << 2);
        uVar16 = 0xfdb1ace;
      }
      uVar17 = (ulong)(uVar16 >> (bVar9 & 0x1f) & 0xf);
    }
  }
LAB_001113d2:
  if ((local_e8 <= uVar8) && (uVar17 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_e8;
  }
  *(uint *)local_f0 = uVar13;
  *(uint *)((long)local_f0 + 4) = uVar19;
  uVar8 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar16 = 0;
  if (uVar8 <= uVar17) {
    bVar9 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar10 = ((4L << (bVar9 & 0x3f)) + (uVar17 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar16 = 0x1f;
    uVar6 = (uint)uVar10;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uVar16 = (uVar16 ^ 0xffffffe0) + 0x1f;
    uVar15 = (ulong)((uVar10 >> ((ulong)uVar16 & 0x3f) & 1) != 0);
    lVar23 = (ulong)uVar16 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar17 = (~(-1 << (bVar9 & 0x1f)) & uVar6) + uVar8 +
             (uVar15 + lVar23 * 2 + 0xfffe << (bVar9 & 0x3f)) | lVar23 * 0x400;
    uVar16 = (uint)(uVar10 - (uVar15 + 2 << ((byte)uVar16 & 0x3f)) >> (bVar9 & 0x3f));
  }
LAB_001114a6:
  *(short *)((long)local_f0 + 0xe) = (short)uVar17;
  *(uint *)(local_f0 + 1) = uVar16;
  if (5 < uVar25) {
    if (uVar25 < 0x82) {
      uVar13 = 0x1f;
      uVar16 = (uint)(uVar25 - 2);
      if (uVar16 != 0) {
        for (; uVar16 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (int)(uVar25 - 2 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar13 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar25 < 0x842) {
      uVar16 = 0x1f;
      if (uVar13 - 0x42 != 0) {
        for (; uVar13 - 0x42 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar13 = (uVar16 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar13 = 0x15;
      if (0x1841 < uVar25) {
        uVar13 = (uint)(ushort)(0x17 - (uVar25 < 0x5842));
      }
    }
  }
  uVar8 = (ulong)(int)uVar19;
  if (uVar8 < 10) {
    uVar16 = uVar19 - 2;
  }
  else if (uVar8 < 0x86) {
    uVar19 = 0x1f;
    uVar16 = (uint)(uVar8 - 6);
    if (uVar16 != 0) {
      for (; uVar16 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar16 = (int)(uVar8 - 6 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar19 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar16 = 0x17;
    if (uVar8 < 0x846) {
      uVar16 = 0x1f;
      if (uVar19 - 0x46 != 0) {
        for (; uVar19 - 0x46 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = (uVar16 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar16;
  uVar5 = (uVar4 & 7) + ((ushort)uVar13 & 7) * 8;
  if ((((uVar17 & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar5 = uVar5 | 0x40;
    }
  }
  else {
    iVar18 = ((uVar13 & 0xffff) >> 3) * 3 + ((uVar16 & 0xffff) >> 3);
    uVar5 = uVar5 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar18 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_f0 + 0xc) = uVar5;
  *num_commands = *num_commands + uVar25;
  position = uVar29 + uVar20;
  uVar8 = local_48;
  if (position < local_48) {
    uVar8 = position;
  }
  uVar10 = uVar20 + 2;
  if (local_e8 < uVar29 >> 2) {
    uVar17 = position + local_e8 * -4;
    if (uVar17 < uVar10) {
      uVar17 = uVar10;
    }
    uVar10 = uVar17;
    if (uVar8 < uVar17) {
      uVar10 = uVar8;
    }
  }
  local_c8[3] = uVar20 + local_50 + uVar29 * 2;
  local_f0 = local_f0 + 2;
  if (uVar10 < uVar8) {
    do {
      *(uint *)(lVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar10 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar10 & 8) & 0xffff) * 4) = (uint)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
  }
LAB_00111708:
  uVar10 = local_70;
  uVar17 = position;
  if (local_70 <= position + 8) goto LAB_001117d8;
  goto LAB_00110cbc;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}